

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indextest.cpp
# Opt level: O0

int testIndexLotsaEntries(void)

{
  int iVar1;
  VRInt VVar2;
  ostream *__a;
  stringstream name_1;
  stringstream name;
  int N;
  int lctr;
  VRDataIndex *n;
  int loopctr;
  int out;
  VRDataIndex *pVVar3;
  VRDataIndex *in_stack_fffffffffffffc28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  VRInt in_stack_fffffffffffffc3c;
  string *in_stack_fffffffffffffc40;
  VRDataIndex *in_stack_fffffffffffffc48;
  string local_3a0 [32];
  VRDatum_conflict *local_380;
  stringstream local_378 [16];
  ostream local_368 [376];
  string local_1f0 [32];
  string local_1d0 [23];
  undefined1 in_stack_fffffffffffffe47;
  string *in_stack_fffffffffffffe48;
  string *in_stack_fffffffffffffe50;
  VRDataIndex *in_stack_fffffffffffffe58;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  int local_18;
  int local_14;
  VRDataIndex *local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  for (local_8 = 0; local_8 < 1; local_8 = local_8 + 1) {
    local_10 = setupIndex();
    local_18 = 1000;
    for (local_14 = 0; local_14 < local_18; local_14 = local_14 + 1) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      in_stack_fffffffffffffc30 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<(local_190,"/henry/entry");
      std::ostream::operator<<(in_stack_fffffffffffffc30,local_14);
      in_stack_fffffffffffffc28 = local_10;
      std::__cxx11::stringstream::str();
      MinVR::VRDataIndex::addData
                (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c);
      std::__cxx11::string::~string(local_1d0);
      std::__cxx11::string::~string(local_1f0);
      std::__cxx11::stringstream::~stringstream(local_1a0);
    }
    for (local_14 = 0; local_14 < local_18; local_14 = local_14 + 1) {
      std::__cxx11::stringstream::stringstream(local_378);
      __a = std::operator<<(local_368,"/henry/entry");
      std::ostream::operator<<(__a,local_14);
      iVar1 = local_14;
      std::__cxx11::stringstream::str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc30,(char *)in_stack_fffffffffffffc28,(allocator<char> *)__a)
      ;
      local_380 = (VRDatum_conflict *)
                  MinVR::VRDataIndex::getValue
                            (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                             in_stack_fffffffffffffe48,(bool)in_stack_fffffffffffffe47);
      VVar2 = MinVR::VRDatumConverter::operator_cast_to_int
                        ((VRDatumConverter<MinVR::VRDatum> *)0x11f8d1);
      local_4 = (uint)(iVar1 != VVar2) + local_4;
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffc40);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffc3f);
      std::__cxx11::string::~string(local_3a0);
      std::__cxx11::stringstream::~stringstream(local_378);
    }
    if (local_10 != (VRDataIndex *)0x0) {
      pVVar3 = local_10;
      MinVR::VRDataIndex::~VRDataIndex(local_10);
      operator_delete(pVVar3,0x98);
    }
  }
  return local_4;
}

Assistant:

int testIndexLotsaEntries() {

  int out = 0;

  LOOP {

    MinVR::VRDataIndex *n = setupIndex();

    int lctr;
    int N = 1000;

    for (lctr = 0; lctr < N; lctr++) {
      std::stringstream name;
      name << "/henry/entry" << lctr;

      n->addData(name.str(), lctr);
    }

    for (lctr = 0; lctr < N; lctr++) {
      std::stringstream name;
      name << "/henry/entry" << lctr;

      out += ((lctr == (int)n->getValue(name.str())) ? 0 : 1);
    }

    delete n;
  }